

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int listen_port;
  ostream *poVar1;
  Server server;
  Server local_160;
  
  if (argc == 2) {
    listen_port = Utils::parse_port(argv[1]);
    Server::Server(&local_160,listen_port);
    Server::run(&local_160);
    Server::~Server(&local_160);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Invalid arguments! Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," listen_port");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(0);
}

Assistant:

int main(int argc, char** argv) {

    if (argc != 2) {
        std::cerr << "Invalid arguments! Usage: " << argv[0] << " listen_port" << std::endl;
        exit(EXIT_SUCCESS);
    }

    try {
        int listen_port = Utils::parse_port(argv[LISTEN_PORT]);
        Server server(listen_port);
        server.run();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
    }
    return 0;
}